

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall wasm::TranslateToFuzzReader::makeHangLimitCheck(TranslateToFuzzReader *this)

{
  Builder *this_00;
  size_t sVar1;
  char *pcVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  Const *pCVar5;
  Expression *pEVar6;
  Expression *pEVar7;
  Block *pBVar8;
  ulong in_RCX;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  
  this_00 = &this->builder;
  sVar1 = (this->HANG_LIMIT_GLOBAL).super_IString.str._M_len;
  pcVar2 = (this->HANG_LIMIT_GLOBAL).super_IString.str._M_str;
  puVar3 = (undefined1 *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
  *puVar3 = 10;
  *(size_t *)(puVar3 + 0x10) = sVar1;
  *(char **)(puVar3 + 0x18) = pcVar2;
  *(undefined8 *)(puVar3 + 8) = 2;
  puVar4 = (undefined1 *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
  *puVar4 = 0xf;
  *(undefined8 *)(puVar4 + 8) = 0;
  *(undefined4 *)(puVar4 + 0x10) = 0x14;
  *(undefined1 **)(puVar4 + 0x18) = puVar3;
  wasm::Unary::finalize();
  sVar1 = (this->HANG_LIMIT_GLOBAL).super_IString.str._M_len;
  pcVar2 = (this->HANG_LIMIT_GLOBAL).super_IString.str._M_str;
  pCVar5 = Builder::makeConst<int>(this_00,(this->fuzzParams->super_FuzzParams).HANG_LIMIT);
  pEVar6 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x28,8);
  pEVar6->_id = GlobalSetId;
  (pEVar6->type).id = 0;
  *(size_t *)(pEVar6 + 1) = sVar1;
  pEVar6[1].type.id = (uintptr_t)pcVar2;
  *(Const **)(pEVar6 + 2) = pCVar5;
  wasm::GlobalSet::finalize();
  pEVar7 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x10,8);
  pEVar7->_id = UnreachableId;
  (pEVar7->type).id = 1;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_RCX;
  pBVar8 = Builder::makeSequence(this_00,pEVar6,pEVar7,type);
  pEVar6 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x28,8);
  pEVar6->_id = IfId;
  (pEVar6->type).id = 0;
  *(undefined1 **)(pEVar6 + 1) = puVar4;
  pEVar6[1].type.id = (uintptr_t)pBVar8;
  *(undefined8 *)(pEVar6 + 2) = 0;
  wasm::If::finalize(pEVar6);
  sVar1 = (this->HANG_LIMIT_GLOBAL).super_IString.str._M_len;
  pcVar2 = (this->HANG_LIMIT_GLOBAL).super_IString.str._M_str;
  puVar3 = (undefined1 *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
  *puVar3 = 10;
  *(size_t *)(puVar3 + 0x10) = sVar1;
  *(char **)(puVar3 + 0x18) = pcVar2;
  *(undefined8 *)(puVar3 + 8) = 2;
  pCVar5 = Builder::makeConst<int>(this_00,1);
  puVar4 = (undefined1 *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x28,8);
  *puVar4 = 0x10;
  *(undefined8 *)(puVar4 + 8) = 0;
  *(undefined4 *)(puVar4 + 0x10) = 1;
  *(undefined1 **)(puVar4 + 0x18) = puVar3;
  *(Const **)(puVar4 + 0x20) = pCVar5;
  wasm::Binary::finalize();
  pEVar7 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x28,8);
  pEVar7->_id = GlobalSetId;
  (pEVar7->type).id = 0;
  *(size_t *)(pEVar7 + 1) = sVar1;
  pEVar7[1].type.id = (uintptr_t)pcVar2;
  *(undefined1 **)(pEVar7 + 2) = puVar4;
  wasm::GlobalSet::finalize();
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_RCX;
  pBVar8 = Builder::makeSequence(this_00,pEVar6,pEVar7,type_00);
  return (Expression *)pBVar8;
}

Assistant:

Expression* TranslateToFuzzReader::makeHangLimitCheck() {
  // If the hang limit global reaches 0 then we trap and reset it. That allows
  // calls to other exports to proceed, with hang checking, after the trap halts
  // the currently called export.
  return builder.makeSequence(
    builder.makeIf(
      builder.makeUnary(UnaryOp::EqZInt32,
                        builder.makeGlobalGet(HANG_LIMIT_GLOBAL, Type::i32)),
      builder.makeSequence(builder.makeGlobalSet(HANG_LIMIT_GLOBAL,
                                                 builder.makeConst(int32_t(
                                                   fuzzParams->HANG_LIMIT))),
                           builder.makeUnreachable())),
    builder.makeGlobalSet(
      HANG_LIMIT_GLOBAL,
      builder.makeBinary(BinaryOp::SubInt32,
                         builder.makeGlobalGet(HANG_LIMIT_GLOBAL, Type::i32),
                         builder.makeConst(int32_t(1)))));
}